

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__server_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  undefined1 local_40 [8];
  timespec timeout;
  int err;
  uv_stream_t *stream;
  uint events_local;
  uv__io_t *w_local;
  uv_loop_t *loop_local;
  
  if ((events & 1) == 0) {
    __assert_fail("events & POLLIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x1fe,"void uv__server_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (w[1].events != 0xffffffff) {
    __assert_fail("stream->accepted_fd == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x1ff,"void uv__server_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (((ulong)w[-1].pending_queue[0] & 1) != 0) {
    __assert_fail("!(stream->flags & UV_HANDLE_CLOSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x200,"void uv__server_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  uv__io_start(*(uv_loop_t **)&w[-3].pevents,w,1);
  while( true ) {
    while( true ) {
      if (w->fd == -1) {
        return;
      }
      if (w[1].events != 0xffffffff) {
        __assert_fail("stream->accepted_fd == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x208,"void uv__server_io(uv_loop_t *, uv__io_t *, unsigned int)");
      }
      timeout.tv_nsec._4_4_ = uv__accept(w->fd);
      if ((int)timeout.tv_nsec._4_4_ < 0) break;
      w[1].events = timeout.tv_nsec._4_4_;
      (*(code *)w[1].watcher_queue[1])(w[-3].watcher_queue + 1,0);
      if (w[1].events != 0xffffffff) {
        uv__io_stop(loop,w,1);
        return;
      }
      if ((w[-3].fd == 0xc) && (((ulong)w[-1].pending_queue[0] & 0x4000000) != 0)) {
        local_40 = (undefined1  [8])0x0;
        timeout.tv_sec = 1;
        nanosleep((timespec *)local_40,(timespec *)0x0);
      }
    }
    if (timeout.tv_nsec._4_4_ == 0xfffffff5) {
      return;
    }
    if (timeout.tv_nsec._4_4_ == 0xfffffff5) break;
    if (timeout.tv_nsec._4_4_ != 0xffffff99) {
      if ((timeout.tv_nsec._4_4_ == 0xffffffe8) || (timeout.tv_nsec._4_4_ == 0xffffffe9)) {
        timeout.tv_nsec._4_4_ = uv__emfile_trick(loop,w->fd);
        if (timeout.tv_nsec._4_4_ == 0xfffffff5) {
          return;
        }
        if (timeout.tv_nsec._4_4_ == 0xfffffff5) {
          return;
        }
      }
      (*(code *)w[1].watcher_queue[1])(w[-3].watcher_queue + 1);
    }
  }
  return;
}

Assistant:

void uv__server_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;
  int err;

  stream = container_of(w, uv_stream_t, io_watcher);
  assert(events & POLLIN);
  assert(stream->accepted_fd == -1);
  assert(!(stream->flags & UV_HANDLE_CLOSING));

  uv__io_start(stream->loop, &stream->io_watcher, POLLIN);

  /* connection_cb can close the server socket while we're
   * in the loop so check it on each iteration.
   */
  while (uv__stream_fd(stream) != -1) {
    assert(stream->accepted_fd == -1);

#if defined(UV_HAVE_KQUEUE)
    if (w->rcount <= 0)
      return;
#endif /* defined(UV_HAVE_KQUEUE) */

    err = uv__accept(uv__stream_fd(stream));
    if (err < 0) {
      if (err == UV_EAGAIN || err == UV__ERR(EWOULDBLOCK))
        return;  /* Not an error. */

      if (err == UV_ECONNABORTED)
        continue;  /* Ignore. Nothing we can do about that. */

      if (err == UV_EMFILE || err == UV_ENFILE) {
        err = uv__emfile_trick(loop, uv__stream_fd(stream));
        if (err == UV_EAGAIN || err == UV__ERR(EWOULDBLOCK))
          break;
      }

      stream->connection_cb(stream, err);
      continue;
    }

    UV_DEC_BACKLOG(w)
    stream->accepted_fd = err;
    stream->connection_cb(stream, 0);

    if (stream->accepted_fd != -1) {
      /* The user hasn't yet accepted called uv_accept() */
      uv__io_stop(loop, &stream->io_watcher, POLLIN);
      return;
    }

    if (stream->type == UV_TCP &&
        (stream->flags & UV_HANDLE_TCP_SINGLE_ACCEPT)) {
      /* Give other processes a chance to accept connections. */
      struct timespec timeout = { 0, 1 };
      nanosleep(&timeout, NULL);
    }
  }
}